

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

errr finish_parse_trap(parser *p)

{
  ushort uVar1;
  trap_kind *ptVar2;
  uint uVar3;
  uint local_24;
  wchar_t tidx;
  trap_kind *n;
  trap_kind *t;
  parser *p_local;
  
  z_info->trap_max = 0;
  for (n = (trap_kind *)parser_priv(p); n != (trap_kind *)0x0; n = n->next) {
    z_info->trap_max = z_info->trap_max + 1;
  }
  trap_info = (trap_kind_conflict *)mem_zalloc((long)(int)(z_info->trap_max + 1) << 7);
  uVar1 = z_info->trap_max;
  n = (trap_kind *)parser_priv(p);
  uVar3 = (uint)uVar1;
  while( true ) {
    local_24 = uVar3 - 1;
    if (n == (trap_kind *)0x0) {
      n = (trap_kind *)parser_priv(p);
      while (n != (trap_kind *)0x0) {
        ptVar2 = n->next;
        mem_free(n);
        n = ptVar2;
      }
      parser_destroy(p);
      return 0;
    }
    if ((int)local_24 < 0) break;
    memcpy(trap_info + (int)local_24,n,0x80);
    trap_info[(int)local_24].tidx = local_24;
    if ((int)local_24 < (int)(z_info->trap_max - 1)) {
      trap_info[(int)local_24].next = (trap_kind *)(trap_info + (int)uVar3);
    }
    else {
      trap_info[(int)local_24].next = (trap_kind *)0x0;
    }
    n = n->next;
    uVar3 = local_24;
  }
  __assert_fail("tidx >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/init.c"
                ,0x79f,"errr finish_parse_trap(struct parser *)");
}

Assistant:

static errr finish_parse_trap(struct parser *p) {
	struct trap_kind *t, *n;
	int tidx;

	/* Scan the list for the max id */
	z_info->trap_max = 0;
	t = parser_priv(p);
	while (t) {
		z_info->trap_max++;
		t = t->next;
	}

	trap_info = mem_zalloc((z_info->trap_max + 1) * sizeof(*t));
	tidx = z_info->trap_max - 1;
    for (t = parser_priv(p); t; t = t->next, tidx--) {
		assert(tidx >= 0);

		memcpy(&trap_info[tidx], t, sizeof(*t));
		trap_info[tidx].tidx = tidx;
		if (tidx < z_info->trap_max - 1)
			trap_info[tidx].next = &trap_info[tidx + 1];
		else
			trap_info[tidx].next = NULL;
    }

    t = parser_priv(p);
    while (t) {
		n = t->next;
		mem_free(t);
		t = n;
    }

    parser_destroy(p);
    return 0;
}